

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O1

void __thiscall
lunasvg::SVGTextFragmentsBuilder::build(SVGTextFragmentsBuilder *this,SVGTextElement *textElement)

{
  float fVar1;
  pointer pcVar2;
  ulong uVar3;
  SVGTextPositioningElement *this_00;
  vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>> *pvVar4;
  SVGTextFragmentIterator SVar5;
  bool bVar6;
  SVGTextFragment *pSVar7;
  bool bVar8;
  AlignmentBaseline AVar9;
  int iVar10;
  size_type sVar11;
  mapped_type *pmVar12;
  long lVar13;
  SVGTextFragment *fragment_1;
  SVGTextFragmentIterator end;
  byte bVar14;
  size_t *__x;
  SVGTextFragment *pSVar15;
  iterator iVar16;
  SVGTextFragmentIterator begin;
  Font *this_01;
  byte bVar17;
  SVGCharacterPositions *this_02;
  SVGTextPosition *position;
  pointer pSVar18;
  SVGTextPositioningElement *pSVar19;
  ulong uVar20;
  pointer pSVar21;
  byte bVar22;
  bool bVar23;
  byte bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  SVGTextFragment fragment;
  float local_104;
  ulong local_e8;
  float local_e0;
  float local_dc;
  u32string_view local_c8;
  pointer local_b8;
  size_t *local_b0;
  SVGCharacterPositions *local_a8;
  SVGTextFragment local_a0;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar24 = 0;
  handleElement(this,&textElement->super_SVGTextPositioningElement);
  pSVar21 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar18 = (this->m_textPositions).
                 super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>
                 ._M_impl.super__Vector_impl_data._M_start; pSVar18 != pSVar21;
      pSVar18 = pSVar18 + 1) {
    fillCharacterPositions(this,pSVar18);
  }
  pSVar18 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pSVar21 = (this->m_textPositions).
            super__Vector_base<lunasvg::SVGTextPosition,_std::allocator<lunasvg::SVGTextPosition>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pSVar18 != pSVar21) {
    pcVar2 = (this->m_text->_M_dataplus)._M_p;
    uVar3 = this->m_text->_M_string_length;
    this_02 = &this->m_characterPositions;
    __x = &this->m_characterOffset;
    local_b8 = pSVar21;
    local_b0 = __x;
    local_a8 = this_02;
    do {
      iVar10 = (*pSVar18->node->_vptr_SVGNode[2])();
      if ((char)iVar10 == '\0') goto LAB_00121511;
      this_00 = (SVGTextPositioningElement *)pSVar18->node->m_parentElement;
      if ((this_00 == (SVGTextPositioningElement *)0x0) ||
         (iVar10 = (*(this_00->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.
                     _vptr_SVGNode[7])(this_00), (char)iVar10 == '\0')) {
LAB_00121568:
        __assert_fail("node && node->isTextPositioningElement()",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                      ,0x11,
                      "const SVGTextPositioningElement *lunasvg::toSVGTextPositioningElement(const SVGNode *)"
                     );
      }
      local_a0.element = this_00;
      Transform::Transform(&local_a0.lengthAdjustTransform);
      local_a0.x = 0.0;
      local_a0.y = 0.0;
      local_a0.angle = 0.0;
      local_a0.width = 0.0;
      local_a0.offset = 0;
      local_a0.length = 0;
      local_a0.startsNewTextChunk = false;
      if ((this_00->m_lengthAdjust).super_SVGProperty.field_0x9 == '\0') {
        bVar8 = SVGElement::hasAttribute((SVGElement *)this_00,TextLength);
      }
      else {
        bVar8 = false;
      }
      local_104 = this_00->m_baseline_offset;
      pSVar19 = this_00;
      while( true ) {
        pSVar19 = (SVGTextPositioningElement *)
                  (pSVar19->super_SVGGraphicsElement).super_SVGElement.super_SVGNode.m_parentElement
        ;
        iVar10 = (*(pSVar19->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode
                   [7])(pSVar19);
        if ((char)iVar10 == '\0') break;
        iVar10 = (*(pSVar19->super_SVGGraphicsElement).super_SVGElement.super_SVGNode._vptr_SVGNode
                   [7])(pSVar19);
        if ((char)iVar10 == '\0') goto LAB_00121568;
        local_104 = local_104 + pSVar19->m_baseline_offset;
      }
      AVar9 = this_00->m_alignment_baseline;
      if (AVar9 < BeforeEdge) {
        if (0xb < (ulong)this_00->m_dominant_baseline) goto LAB_001215a1;
        AVar9 = (&DAT_001445b1)[this_00->m_dominant_baseline];
      }
      this_01 = &this_00->m_font;
      switch(AVar9) {
      case BeforeEdge:
      case TextBeforeEdge:
        fVar25 = Font::ascent(this_01);
        goto LAB_00121188;
      case Middle:
        fVar25 = Font::xHeight(this_01);
        break;
      case Central:
        fVar26 = Font::ascent(this_01);
        fVar25 = Font::descent(this_01);
        fVar25 = fVar25 + fVar26;
        break;
      case AfterEdge:
      case TextAfterEdge:
      case Ideographic:
        fVar25 = Font::descent(this_01);
LAB_00121188:
        local_104 = local_104 - fVar25;
      default:
        goto switchD_00121174_caseD_9;
      case Hanging:
        fVar25 = Font::ascent(this_01);
        fVar25 = (fVar25 * -8.0) / 10.0;
        goto LAB_001211e6;
      case Mathematical:
        fVar25 = Font::ascent(this_01);
      }
      fVar25 = fVar25 * -0.5;
LAB_001211e6:
      local_104 = local_104 + fVar25;
switchD_00121174_caseD_9:
      uVar20 = pSVar18->startOffset;
      local_e8 = uVar20;
      if (uVar20 < pSVar18->endOffset) {
        bVar6 = false;
        fVar25 = 0.0;
        do {
          sVar11 = std::
                   map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                   ::count(this_02,__x);
          if (sVar11 == 0) {
            bVar22 = 0;
            fVar27 = 0.0;
            fVar28 = 0.0;
            bVar17 = 0;
            fVar26 = 0.0;
          }
          else {
            pmVar12 = std::
                      map<unsigned_long,_lunasvg::SVGCharacterPosition,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_lunasvg::SVGCharacterPosition>_>_>
                      ::at(this_02,__x);
            if (((pmVar12->rotate).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
              fVar26 = 0.0;
            }
            else {
              fVar26 = (pmVar12->rotate).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
            }
            local_dc = (pmVar12->x).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
            bVar17 = (pmVar12->x).super__Optional_base<float,_true,_true>._M_payload.
                     super__Optional_payload_base<float>._M_engaged;
            local_e0 = (pmVar12->y).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
            bVar22 = (pmVar12->y).super__Optional_base<float,_true,_true>._M_payload.
                     super__Optional_payload_base<float>._M_engaged;
            fVar27 = (pmVar12->dy).super__Optional_base<float,_true,_true>._M_payload.
                     super__Optional_payload_base<float>._M_payload._M_value;
            if (((pmVar12->dx).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
              fVar28 = 0.0;
            }
            else {
              fVar28 = (pmVar12->dx).super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload._M_value;
            }
            if (((pmVar12->dy).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_engaged & 1U) == 0) {
              fVar27 = 0.0;
            }
          }
          bVar14 = 1;
          if (bVar8 == false && (bVar17 & 1) == 0) {
            bVar14 = fVar26 != fVar25 | fVar26 != 0.0 | bVar22 | -(fVar28 != 0.0 || fVar27 != 0.0);
          }
          if (((bVar14 & 1) != 0) && (bVar6)) {
            local_58 = ZEXT416((uint)fVar28);
            local_48 = ZEXT416((uint)fVar27);
            if (uVar3 < local_e8) goto LAB_00121587;
            local_c8._M_len = uVar20 - local_e8;
            if (uVar3 - local_e8 < uVar20 - local_e8) {
              local_c8._M_len = uVar3 - local_e8;
            }
            local_c8._M_str = pcVar2 + local_e8;
            local_a0.offset = local_e8;
            local_a0.length = local_c8._M_len;
            fVar25 = Font::measureText(this_01,&local_c8);
            local_a0.width = fVar25;
            pvVar4 = (vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>> *)
                     this->m_fragments;
            iVar16._M_current = *(SVGTextFragment **)(pvVar4 + 8);
            if (iVar16._M_current == *(SVGTextFragment **)(pvVar4 + 0x10)) {
              std::vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>>::
              _M_realloc_insert<lunasvg::SVGTextFragment_const&>(pvVar4,iVar16,&local_a0);
            }
            else {
              pSVar15 = &local_a0;
              for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                (iVar16._M_current)->element = pSVar15->element;
                pSVar15 = (SVGTextFragment *)((long)pSVar15 + ((ulong)bVar24 * -2 + 1) * 8);
                iVar16._M_current = iVar16._M_current + (ulong)bVar24 * -0x10 + 8;
              }
              *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x48;
            }
            this->m_x = local_a0.width + this->m_x;
            fVar27 = (float)local_48._0_4_;
            fVar28 = (float)local_58._0_4_;
            local_e8 = uVar20;
          }
          if (((bVar17 | bVar22) & 1) == 0) {
            bVar23 = false;
          }
          else {
            bVar23 = uVar20 == pSVar18->startOffset;
          }
          if (((bVar14 & 1) != 0 || bVar23 != false) || (!bVar6)) {
            fVar25 = local_dc;
            if ((bVar17 & 1) == 0) {
              fVar25 = this->m_x;
            }
            this->m_x = fVar28 + fVar25;
            fVar1 = local_e0;
            if ((bVar22 & 1) == 0) {
              fVar1 = this->m_y;
            }
            this->m_y = fVar27 + fVar1;
            local_a0.y = (fVar27 + fVar1) - local_104;
            local_a0.x = fVar28 + fVar25;
            local_a0.angle = fVar26;
            bVar6 = true;
            local_a0.startsNewTextChunk = bVar23;
          }
          *local_b0 = *local_b0 + 1;
          uVar20 = uVar20 + 1;
          __x = local_b0;
          this_02 = local_a8;
          fVar25 = fVar26;
        } while (uVar20 < pSVar18->endOffset);
      }
      if (uVar3 < local_e8) {
LAB_00121587:
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   local_e8,uVar3);
LAB_001215a1:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgtextelement.cpp"
                      ,0x2e,
                      "AlignmentBaseline lunasvg::resolveDominantBaseline(const SVGTextPositioningElement *)"
                     );
      }
      local_c8._M_len = uVar20 - local_e8;
      if (uVar3 - local_e8 < uVar20 - local_e8) {
        local_c8._M_len = uVar3 - local_e8;
      }
      local_c8._M_str = pcVar2 + local_e8;
      local_a0.offset = local_e8;
      local_a0.length = local_c8._M_len;
      fVar25 = Font::measureText(this_01,&local_c8);
      pSVar21 = local_b8;
      local_a0.width = fVar25;
      pvVar4 = (vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>> *)
               this->m_fragments;
      iVar16._M_current = *(SVGTextFragment **)(pvVar4 + 8);
      if (iVar16._M_current == *(SVGTextFragment **)(pvVar4 + 0x10)) {
        std::vector<lunasvg::SVGTextFragment,std::allocator<lunasvg::SVGTextFragment>>::
        _M_realloc_insert<lunasvg::SVGTextFragment_const&>(pvVar4,iVar16,&local_a0);
      }
      else {
        pSVar15 = &local_a0;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          (iVar16._M_current)->element = pSVar15->element;
          pSVar15 = (SVGTextFragment *)((long)pSVar15 + ((ulong)bVar24 * -2 + 1) * 8);
          iVar16._M_current = iVar16._M_current + (ulong)bVar24 * -0x10 + 8;
        }
        *(long *)(pvVar4 + 8) = *(long *)(pvVar4 + 8) + 0x48;
      }
      this->m_x = local_a0.width + this->m_x;
LAB_00121511:
      pSVar18 = pSVar18 + 1;
    } while (pSVar18 != pSVar21);
  }
  begin._M_current =
       (this->m_fragments->
       super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>).
       _M_impl.super__Vector_impl_data._M_start;
  pSVar15 = (this->m_fragments->
            super__Vector_base<lunasvg::SVGTextFragment,_std::allocator<lunasvg::SVGTextFragment>_>)
            ._M_impl.super__Vector_impl_data._M_finish;
  SVar5._M_current = begin._M_current;
  if (begin._M_current != pSVar15) {
    while (end._M_current = SVar5._M_current + 1, end._M_current != pSVar15) {
      pSVar7 = SVar5._M_current + 1;
      SVar5._M_current = end._M_current;
      if (pSVar7->startsNewTextChunk == true) {
        handleTextChunk(begin,end);
        begin._M_current = end._M_current;
      }
    }
    handleTextChunk(begin,end);
  }
  return;
}

Assistant:

void SVGTextFragmentsBuilder::build(const SVGTextElement* textElement)
{
    handleElement(textElement);
    for(const auto& position : m_textPositions) {
        fillCharacterPositions(position);
    }

    std::u32string_view wholeText(m_text);
    for(const auto& textPosition : m_textPositions) {
        if(!textPosition.node->isTextNode())
            continue;
        auto element = toSVGTextPositioningElement(textPosition.node->parentElement());
        SVGTextFragment fragment(element);
        auto recordTextFragment = [&](auto startOffset, auto endOffset) {
            auto text = wholeText.substr(startOffset, endOffset - startOffset);
            fragment.offset = startOffset;
            fragment.length = text.length();
            fragment.width = element->font().measureText(text);
            m_fragments.push_back(fragment);
            m_x += fragment.width;
        };

        auto needsTextLengthSpacing = element->lengthAdjust() == LengthAdjust::Spacing && element->hasAttribute(PropertyID::TextLength);
        auto baselineOffset = calculateBaselineOffset(element);
        auto startOffset = textPosition.startOffset;
        auto textOffset = textPosition.startOffset;
        auto didStartTextFragment = false;
        auto lastAngle = 0.f;
        while(textOffset < textPosition.endOffset) {
            SVGCharacterPosition characterPosition;
            if(m_characterPositions.count(m_characterOffset) > 0) {
                characterPosition = m_characterPositions.at(m_characterOffset);
            }

            auto angle = characterPosition.rotate.value_or(0);
            auto dx = characterPosition.dx.value_or(0);
            auto dy = characterPosition.dy.value_or(0);

            auto shouldStartNewFragment = needsTextLengthSpacing || characterPosition.x || characterPosition.y || dx || dy || angle || angle != lastAngle;
            if(shouldStartNewFragment && didStartTextFragment) {
                recordTextFragment(startOffset, textOffset);
                startOffset = textOffset;
            }

            auto startsNewTextChunk = (characterPosition.x || characterPosition.y) && textOffset == textPosition.startOffset;
            if(startsNewTextChunk || shouldStartNewFragment || !didStartTextFragment) {
                m_x = dx + characterPosition.x.value_or(m_x);
                m_y = dy + characterPosition.y.value_or(m_y);
                fragment.x = m_x;
                fragment.y = m_y - baselineOffset;
                fragment.angle = angle;
                fragment.startsNewTextChunk = startsNewTextChunk;
                didStartTextFragment = true;
            }

            lastAngle = angle;
            ++textOffset;
            ++m_characterOffset;
        }

        recordTextFragment(startOffset, textOffset);
    }

    if(m_fragments.empty())
        return;
    auto it = m_fragments.begin();
    auto begin = m_fragments.begin();
    auto end = m_fragments.end();
    for(++it; it != end; ++it) {
        const SVGTextFragment& fragment = *it;
        if(!fragment.startsNewTextChunk)
            continue;
        handleTextChunk(begin, it);
        begin = it;
    }

    handleTextChunk(begin, it);
}